

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
::table_core(table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
             *this,table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                   *x,allocator<std::pair<const_std::type_index,_std::any>_> *al_)

{
  float fVar1;
  
  fVar1 = ceilf((float)(x->size_ctrl).size / 0.875);
  table_core(this,(long)(fVar1 - 9.223372e+18) & (long)fVar1 >> 0x3f | (long)fVar1,
             (hash<std::type_index,_void> *)x,(equal_to<std::type_index> *)x,al_);
  copy_elements_from(this,x);
  return;
}

Assistant:

table_core(const table_core& x, const Allocator& al_) :
        table_core{std::size_t(std::ceil(float(x.size()) / mlf)), x.h(), x.pred(), al_} {
        copy_elements_from(x);
    }